

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_TOUCH(effect_handler_context_t *context)

{
  _Bool _Var1;
  wchar_t dam_00;
  monster_conflict *pmVar2;
  monster *pmVar3;
  loc_conflict lVar4;
  trap *trap;
  source sVar5;
  source origin;
  source origin_00;
  wchar_t local_6c;
  wchar_t flg_1;
  wchar_t wStack_38;
  wchar_t flg;
  loc_conflict decoy;
  monster *t_mon;
  monster *mon;
  wchar_t rad;
  wchar_t dam;
  effect_handler_context_t *context_local;
  
  dam_00 = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  if (context->radius == L'\0') {
    local_6c = L'\x01';
  }
  else {
    local_6c = context->radius;
  }
  if ((context->origin).what == SRC_MONSTER) {
    pmVar2 = cave_monster(cave,(context->origin).which.monster);
    pmVar3 = monster_target_monster((effect_handler_context_t_conflict *)context);
    lVar4 = (loc_conflict)cave_find_decoy(cave);
    flg = lVar4.y;
    if ((flg != L'\0') && (wStack_38 = lVar4.x, wStack_38 != L'\0')) {
      trap = square_trap((chunk *)cave,lVar4);
      sVar5 = source_trap(trap);
      origin._4_4_ = 0;
      origin.what = sVar5.what;
      origin.which.trap = sVar5.which.trap;
      _Var1 = project(origin,local_6c,lVar4,dam_00,context->subtype,L'ô',L'\0','\0',context->obj);
      return _Var1;
    }
    if (pmVar3 != (monster *)0x0) {
      sVar5 = source_monster((pmVar2->target).midx);
      origin_00._4_4_ = 0;
      origin_00.what = sVar5.what;
      lVar4.x = (pmVar3->grid).x;
      lVar4.y = (pmVar3->grid).y;
      origin_00.which.trap = sVar5.which.trap;
      _Var1 = project(origin_00,local_6c,lVar4,dam_00,context->subtype,L'ô',L'\0','\0',context->obj
                     );
      return _Var1;
    }
  }
  _Var1 = project_touch(dam_00,local_6c,context->subtype,false,context->obj);
  if (_Var1) {
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_TOUCH(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int rad = context->radius ? context->radius : 1;

	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		struct monster *t_mon = monster_target_monster(context);
		struct loc decoy = cave_find_decoy(cave);

		/* Target decoy */
		if (decoy.y && decoy.x) {
			int flg = PROJECT_GRID | PROJECT_KILL | PROJECT_HIDE | PROJECT_ITEM | PROJECT_THRU;
			return (project(source_trap(square_trap(cave, decoy)),
					rad, decoy, dam, context->subtype,flg, 0, 0, context->obj));
		}

		/* Monster cast at monster */
		if (t_mon) {
			int flg = PROJECT_GRID | PROJECT_KILL | PROJECT_HIDE | PROJECT_ITEM | PROJECT_THRU;
			return (project(source_monster(mon->target.midx), rad,
							t_mon->grid, dam, context->subtype,
							flg, 0, 0, context->obj));
		}
	}

	if (project_touch(dam, rad, context->subtype, false, context->obj))
		context->ident = true;
	return true;
}